

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  bool bVar2;
  size_t sVar3;
  int iVar4;
  Parameters params;
  char local_49;
  Parameters local_48;
  
  paVar1 = &local_48.filter.field_2;
  local_48.filter._M_string_length = 0;
  local_48.filter.field_2._M_local_buf[0] = '\0';
  local_48.filter._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = parse_args(argc,argv,&local_48);
  if (bVar2) {
    iVar4 = 0;
    flag_test(&local_48);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1230c0);
    }
    else {
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[input-size [iterations-count [function-filter]]]",0x31);
    local_49 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_49,1);
    iVar4 = 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.filter._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.filter._M_dataplus._M_p);
  }
  return iVar4;
}

Assistant:

int main(int argc, char **argv) {
    Parameters params;

    if (!parse_args(argc, argv, params)) {
        std::cout << "Usage: " << argv[0] << "[input-size [iterations-count [function-filter]]]" << '\n';
        return EXIT_FAILURE;
    }

    flag_test(params);
    return EXIT_SUCCESS;
}